

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void read_bytes<int>(void *ptr,size_t n_els,istream *in)

{
  if (n_els != 0) {
    std::istream::read((char *)in,(long)ptr);
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 1) != 0) {
      throw_errno();
    }
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, std::istream &in)
{
    if (n_els == 0) return;
    in.read((char*)ptr, n_els * sizeof(dtype));
    if (unlikely(in.bad())) throw_errno();
}